

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexDecomposition.h
# Opt level: O1

void __thiscall
ConvexDecomposition::ConvexResult::ConvexResult
          (ConvexResult *this,uint hvcount,float *hvertices,uint htcount,uint *hindices)

{
  float *__dest;
  uint *__dest_00;
  
  this->mHullVcount = hvcount;
  if (hvcount == 0) {
    this->mHullVertices = (float *)0x0;
  }
  else {
    __dest = (float *)operator_new__((ulong)hvcount * 0x30);
    this->mHullVertices = __dest;
    memcpy(__dest,hvertices,(ulong)hvcount * 0xc);
  }
  this->mHullTcount = htcount;
  if (htcount != 0) {
    __dest_00 = (uint *)operator_new__((ulong)htcount * 0x30);
    this->mHullIndices = __dest_00;
    memcpy(__dest_00,hindices,(ulong)htcount * 0xc);
    return;
  }
  this->mHullIndices = (uint *)0x0;
  return;
}

Assistant:

ConvexResult(unsigned int hvcount,const float *hvertices,unsigned int htcount,const unsigned int *hindices)
		{
			mHullVcount = hvcount;
			if ( mHullVcount )
			{
				mHullVertices = new float[mHullVcount*sizeof(float)*3];
				memcpy(mHullVertices, hvertices, sizeof(float)*3*mHullVcount );
			}
			else
			{
				mHullVertices = 0;
			}

			mHullTcount = htcount;

			if ( mHullTcount )
			{
				mHullIndices = new unsigned int[sizeof(unsigned int)*mHullTcount*3];
				memcpy(mHullIndices,hindices, sizeof(unsigned int)*mHullTcount*3 );
			}
			else
			{
				mHullIndices = 0;
			}

		}